

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_run_container_andnot
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  int local_38;
  int local_34;
  int i;
  int dest_card;
  uint uStack_28;
  uint16_t val;
  int which_run;
  int32_t run_end;
  int32_t run_start;
  array_container_t *dst_local;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  if (dst->capacity < src_1->cardinality) {
    array_container_grow(dst,src_1->cardinality,false);
  }
  if (src_2->n_runs == 0) {
    memmove(dst->array,src_1->array,(long)src_1->cardinality << 1);
    dst->cardinality = src_1->cardinality;
  }
  else {
    which_run = (int)src_2->runs->value;
    uStack_28 = which_run + (uint)src_2->runs->length;
    dest_card = 0;
    local_34 = 0;
    for (local_38 = 0; local_38 < src_1->cardinality; local_38 = local_38 + 1) {
      uVar1 = src_1->array[local_38];
      if ((uint)uVar1 < (uint)which_run) {
        dst->array[local_34] = uVar1;
        local_34 = local_34 + 1;
      }
      else if (uStack_28 < uVar1) {
        do {
          if (dest_card + 1 < src_2->n_runs) {
            dest_card = dest_card + 1;
            which_run = (int)src_2->runs[dest_card].value;
            uStack_28 = which_run + (uint)src_2->runs[dest_card].length;
          }
          else {
            uStack_28 = 0x10001;
            which_run = 0x10001;
          }
        } while (uStack_28 < uVar1);
        local_38 = local_38 + -1;
      }
    }
    dst->cardinality = local_34;
  }
  return;
}

Assistant:

void array_run_container_andnot(const array_container_t *src_1,
                                const run_container_t *src_2,
                                array_container_t *dst) {
    // basically following Java impl as of June 2016
    if (src_1->cardinality > dst->capacity) {
        array_container_grow(dst, src_1->cardinality, false);
    }

    if (src_2->n_runs == 0) {
        memmove(dst->array, src_1->array,
                sizeof(uint16_t) * src_1->cardinality);
        dst->cardinality = src_1->cardinality;
        return;
    }
    int32_t run_start = src_2->runs[0].value;
    int32_t run_end = run_start + src_2->runs[0].length;
    int which_run = 0;

    uint16_t val = 0;
    int dest_card = 0;
    for (int i = 0; i < src_1->cardinality; ++i) {
        val = src_1->array[i];
        if (val < run_start)
            dst->array[dest_card++] = val;
        else if (val <= run_end) {
            ;  // omitted item
        } else {
            do {
                if (which_run + 1 < src_2->n_runs) {
                    ++which_run;
                    run_start = src_2->runs[which_run].value;
                    run_end = run_start + src_2->runs[which_run].length;

                } else
                    run_start = run_end = (1 << 16) + 1;
            } while (val > run_end);
            --i;
        }
    }
    dst->cardinality = dest_card;
}